

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

void __thiscall crnlib::qdxt1::optimize_selectors_task(qdxt1 *this,uint64 data,void *pData_ptr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  crn_thread_id_t cVar5;
  uint *puVar6;
  uint *in_RDX;
  uint in_ESI;
  qdxt1 *in_RDI;
  dxt1_block *dst_block_1;
  uint block_index_2;
  uint block_iter_2;
  uint error;
  color_quad_u8 colors [4];
  dxt1_block *dst_block;
  color_quad_u8 *orig_color;
  uint block_index_1;
  uint block_iter_1;
  uint64 total_error;
  uint s;
  uint max_s;
  uint64 best_error;
  uint best_s;
  uint x;
  uint y;
  vector<unsigned_int> *block_indices;
  uint block_type;
  dxt1_block blk;
  color_quad_u8 *src;
  uint i;
  color_quad_u8 *pSrc_pixels;
  bool has_alpha_pixels;
  dxt1_block *src_block;
  uint block_index;
  uint block_iter;
  vector<unsigned_int> *selector_indices;
  uint cluster_index;
  vector<unsigned_int> block_categories [2];
  optimize_selectors_params *task_params;
  uint thread_index;
  undefined7 in_stack_fffffffffffffdb8;
  undefined1 in_stack_fffffffffffffdbf;
  vector<unsigned_int> *in_stack_fffffffffffffdc0;
  vector<unsigned_int> *this_00;
  color_quad_u8 *in_stack_fffffffffffffdc8;
  vector<unsigned_int> *pvVar7;
  vector<unsigned_int> *in_stack_fffffffffffffdd0;
  qdxt1 *in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  color_quad<unsigned_char,_int> *local_1e0;
  vector<unsigned_int> *local_128;
  uint local_110;
  color_quad<unsigned_char,_int> local_108 [4];
  color_quad<unsigned_char,_int> acStack_f8 [2];
  dxt1_block *local_f0;
  color_quad_u8 *local_e8;
  uint local_e0;
  uint local_dc;
  ulong local_d8;
  uint local_d0;
  uint local_cc;
  ulong local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  vector<unsigned_int> *local_b0;
  uint local_a4;
  dxt1_block local_a0;
  color_quad_u8 *local_98;
  uint local_8c;
  dxt_pixel_block *local_88;
  char local_79;
  dxt1_block *local_78;
  uint local_70;
  uint local_6c;
  vector<unsigned_int> *local_68;
  undefined4 local_5c;
  uint local_58;
  vector<unsigned_int> local_48 [2];
  vector<unsigned_int> local_28 [2];
  
  local_128 = local_48;
  local_28[0].m_p = in_RDX;
  local_28[0].m_capacity = in_ESI;
  do {
    vector<unsigned_int>::vector(local_128);
    local_128 = local_128 + 1;
  } while (local_128 != local_28);
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec);
  vector<unsigned_int>::reserve
            ((vector<unsigned_int> *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             in_stack_fffffffffffffdec);
  local_58 = 0;
  do {
    uVar1 = local_58;
    uVar3 = vector<crnlib::vector<unsigned_int>_>::size
                      (*(vector<crnlib::vector<unsigned_int>_> **)local_28[0].m_p);
    if (uVar3 <= uVar1) {
      local_5c = 0;
LAB_0017be02:
      pvVar7 = local_48;
      this_00 = local_28;
      do {
        this_00 = this_00 + -1;
        vector<unsigned_int>::~vector(this_00);
      } while (this_00 != pvVar7);
      return;
    }
    if ((in_RDI->m_canceled & 1U) != 0) {
      local_5c = 1;
      goto LAB_0017be02;
    }
    if (((local_58 & 0xff) == 0) &&
       (cVar5 = crn_get_current_thread_id(), cVar5 == in_RDI->m_main_thread_id)) {
      vector<crnlib::vector<unsigned_int>_>::size
                (*(vector<crnlib::vector<unsigned_int>_> **)local_28[0].m_p);
      bVar2 = update_progress(in_stack_fffffffffffffdd8,
                              (uint)((ulong)in_stack_fffffffffffffdd0 >> 0x20),
                              (uint)in_stack_fffffffffffffdd0);
      if (!bVar2) {
        local_5c = 1;
        goto LAB_0017be02;
      }
    }
    uVar3 = task_pool::get_num_threads(in_RDI->m_pTask_pool);
    uVar1 = local_58;
    if ((uVar3 == 0) ||
       (uVar3 = task_pool::get_num_threads(in_RDI->m_pTask_pool),
       uVar1 % (uVar3 + 1) == local_28[0].m_capacity)) {
      local_68 = vector<crnlib::vector<unsigned_int>_>::operator[]
                           (*(vector<crnlib::vector<unsigned_int>_> **)local_28[0].m_p,local_58);
      uVar3 = vector<unsigned_int>::size(local_68);
      if (1 < uVar3) {
        vector<unsigned_int>::resize
                  (in_stack_fffffffffffffdd0,(uint)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x18,0));
        vector<unsigned_int>::resize
                  (in_stack_fffffffffffffdd0,(uint)((ulong)in_stack_fffffffffffffdc8 >> 0x20),
                   SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x18,0));
        for (local_6c = 0; uVar1 = local_6c, uVar3 = vector<unsigned_int>::size(local_68),
            uVar1 < uVar3; local_6c = local_6c + 1) {
          puVar6 = vector<unsigned_int>::operator[](local_68,local_6c);
          local_70 = *puVar6;
          local_78 = get_block(in_RDI,local_70);
          bVar2 = dxt1_block::is_alpha_block((dxt1_block *)in_stack_fffffffffffffdc0);
          if (bVar2) {
            local_79 = '\0';
            if ((in_RDI->m_params).m_dxt1a_alpha_threshold != 0) {
              local_88 = in_RDI->m_pBlocks + local_70;
              for (local_8c = 0; local_8c < 0x10; local_8c = local_8c + 1) {
                local_98 = local_88->m_pixels[0] + local_8c;
                if ((uint)(local_98->field_0).field_0.a < (in_RDI->m_params).m_dxt1a_alpha_threshold
                   ) {
                  local_79 = '\x01';
                  break;
                }
              }
            }
            if (local_79 == '\0') {
              vector<unsigned_int>::push_back
                        (in_stack_fffffffffffffdc0,
                         (uint *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
            }
          }
          else {
            vector<unsigned_int>::push_back
                      (in_stack_fffffffffffffdc0,
                       (uint *)CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8));
          }
        }
        utils::zero_object<crnlib::dxt1_block>((dxt1_block *)0x17b9b9);
        for (local_a4 = 0; local_a4 < 2; local_a4 = local_a4 + 1) {
          local_b0 = local_48 + local_a4;
          uVar3 = vector<unsigned_int>::size(local_b0);
          if (1 < uVar3) {
            for (local_b4 = 0; local_b4 < 4; local_b4 = local_b4 + 1) {
              for (local_b8 = 0; local_b8 < 4; local_b8 = local_b8 + 1) {
                local_bc = 0;
                local_c8 = 0xffffffffff;
                local_cc = 4;
                if (local_a4 == 1) {
                  local_cc = 3;
                }
                for (local_d0 = 0; local_d0 < local_cc; local_d0 = local_d0 + 1) {
                  local_d8 = 0;
                  for (local_dc = 0; uVar1 = local_dc, uVar3 = vector<unsigned_int>::size(local_b0),
                      uVar1 < uVar3; local_dc = local_dc + 1) {
                    puVar6 = vector<unsigned_int>::operator[](local_b0,local_dc);
                    local_e0 = *puVar6;
                    local_e8 = in_RDI->m_pBlocks[local_e0].m_pixels[local_b4] + local_b8;
                    local_f0 = get_block(in_RDI,local_e0);
                    local_1e0 = local_108;
                    do {
                      color_quad<unsigned_char,_int>::color_quad(local_1e0);
                      local_1e0 = local_1e0 + 1;
                    } while (local_1e0 != acStack_f8);
                    dxt1_block::get_low_color(local_f0);
                    dxt1_block::get_high_color(local_f0);
                    dxt1_block::get_block_colors
                              ((color_quad_u8 *)
                               CONCAT17(in_stack_fffffffffffffdbf,in_stack_fffffffffffffdb8),0,0);
                    uVar3 = crnlib::color::color_distance
                                      (SUB81((ulong)in_stack_fffffffffffffdd0 >> 0x18,0),
                                       in_stack_fffffffffffffdc8,
                                       (color_quad_u8 *)in_stack_fffffffffffffdc0,
                                       (bool)in_stack_fffffffffffffdbf);
                    local_d8 = uVar3 + local_d8;
                  }
                  if (local_d8 < local_c8) {
                    local_c8 = local_d8;
                    local_bc = local_d0;
                  }
                }
                dxt1_block::set_selector(&local_a0,local_b8,local_b4,local_bc);
              }
            }
            local_110 = 0;
            while (uVar3 = local_110, uVar4 = vector<unsigned_int>::size(local_b0), uVar3 < uVar4) {
              puVar6 = vector<unsigned_int>::operator[](local_b0,local_110);
              in_stack_fffffffffffffdd8 = (qdxt1 *)get_block(in_RDI,*puVar6);
              *(uint8 (*) [4])((long)&in_stack_fffffffffffffdd8->m_pTask_pool + 4) =
                   local_a0.m_selectors;
              local_110 = local_110 + 1;
            }
          }
        }
      }
    }
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

void qdxt1::optimize_selectors_task(uint64 data, void* pData_ptr) {
  const uint thread_index = static_cast<uint>(data);

  optimize_selectors_params& task_params = *static_cast<optimize_selectors_params*>(pData_ptr);

  crnlib::vector<uint> block_categories[2];
  block_categories[0].reserve(2048);
  block_categories[1].reserve(2048);

  for (uint cluster_index = 0; cluster_index < task_params.m_selector_cluster_indices.size(); cluster_index++) {
    if (m_canceled)
      return;

    if ((cluster_index & 255) == 0) {
      if (crn_get_current_thread_id() == m_main_thread_id) {
        if (!update_progress(cluster_index, task_params.m_selector_cluster_indices.size() - 1))
          return;
      }
    }

    if (m_pTask_pool->get_num_threads()) {
      if ((cluster_index % (m_pTask_pool->get_num_threads() + 1)) != thread_index)
        continue;
    }

    const crnlib::vector<uint>& selector_indices = task_params.m_selector_cluster_indices[cluster_index];

    if (selector_indices.size() <= 1)
      continue;

    block_categories[0].resize(0);
    block_categories[1].resize(0);

    for (uint block_iter = 0; block_iter < selector_indices.size(); block_iter++) {
      const uint block_index = selector_indices[block_iter];

      const dxt1_block& src_block = get_block(block_index);

      if (!src_block.is_alpha_block())
        block_categories[0].push_back(block_index);
      else {
        bool has_alpha_pixels = false;

        if (m_params.m_dxt1a_alpha_threshold > 0) {
          const color_quad_u8* pSrc_pixels = (const color_quad_u8*)m_pBlocks[block_index].m_pixels;

          for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++) {
            const color_quad_u8& src = pSrc_pixels[i];
            if (src.a < m_params.m_dxt1a_alpha_threshold) {
              has_alpha_pixels = true;
              break;
            }
          }
        }

        if (has_alpha_pixels)
          continue;

        block_categories[1].push_back(block_index);
      }
    }

    dxt1_block blk;
    utils::zero_object(blk);

    for (uint block_type = 0; block_type <= 1; block_type++) {
      const crnlib::vector<uint>& block_indices = block_categories[block_type];
      if (block_indices.size() <= 1)
        continue;

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          uint best_s = 0;
          uint64 best_error = 0xFFFFFFFFFFULL;

          uint max_s = 4;
          if (block_type == 1)
            max_s = 3;

          for (uint s = 0; s < max_s; s++) {
            uint64 total_error = 0;

            for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++) {
              const uint block_index = block_indices[block_iter];

              const color_quad_u8& orig_color = m_pBlocks[block_index].m_pixels[y][x];

              const dxt1_block& dst_block = get_block(block_index);

              color_quad_u8 colors[4];
              dxt1_block::get_block_colors(colors, static_cast<uint16>(dst_block.get_low_color()), static_cast<uint16>(dst_block.get_high_color()));

              uint error = color::color_distance(m_params.m_perceptual, orig_color, colors[s], false);

              total_error += error;
            }

            if (total_error < best_error) {
              best_error = total_error;
              best_s = s;
            }
          }

          blk.set_selector(x, y, best_s);

        }  // x
      }    // y

      for (uint block_iter = 0; block_iter < block_indices.size(); block_iter++) {
        const uint block_index = block_indices[block_iter];

        dxt1_block& dst_block = get_block(block_index);

        memcpy(dst_block.m_selectors, blk.m_selectors, sizeof(dst_block.m_selectors));
      }
    }

  }  // cluster_index
}